

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_unix_socket_address.c
# Opt level: O3

int main(void)

{
  int iVar1;
  
  UnityBegin(
            "/workspace/llm4binary/github/license_c_cmakelists/gatzka[P]cio/tests/linux/test_linux_unix_socket_address.c"
            );
  UnityDefaultTestRun(test_init_uds_socket_address,"test_init_uds_socket_address",0x5a);
  UnityDefaultTestRun(test_init_uds_socket_address_no_sock_addr,
                      "test_init_uds_socket_address_no_sock_addr",0x5b);
  UnityDefaultTestRun(test_init_uds_socket_address_no_path,"test_init_uds_socket_address_no_path",
                      0x5c);
  UnityDefaultTestRun(test_init_uds_socket_address_path_too_long,
                      "test_init_uds_socket_address_path_too_long",0x5d);
  UnityDefaultTestRun(test_init_abstract_uds_socket_address,"test_init_abstract_uds_socket_address",
                      0x5e);
  iVar1 = UnityEnd();
  return iVar1;
}

Assistant:

int main(void)
{
	UNITY_BEGIN();
	RUN_TEST(test_init_uds_socket_address);
	RUN_TEST(test_init_uds_socket_address_no_sock_addr);
	RUN_TEST(test_init_uds_socket_address_no_path);
	RUN_TEST(test_init_uds_socket_address_path_too_long);
	RUN_TEST(test_init_abstract_uds_socket_address);

	return UNITY_END();
}